

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O1

void __thiscall HuffmanDecoder::run(HuffmanDecoder *this)

{
  size_t *psVar1;
  list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> *this_00;
  _Rb_tree_header *p_Var2;
  char cVar3;
  uint uVar4;
  pointer pcVar5;
  _List_node_base *p_Var6;
  long lVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  element_type *peVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  element_type *peVar10;
  int iVar11;
  uint *puVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  long lVar14;
  long lVar15;
  mapped_type *pmVar16;
  _Node *p_Var17;
  _Base_ptr p_Var18;
  HuffmanNode *this_02;
  undefined8 uVar19;
  undefined1 *puVar20;
  ulong uVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  bool bVar22;
  value_type root;
  shared_ptr<HuffmanNode> parent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_freq;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_amount;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> symbols;
  stringstream output;
  undefined1 *local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  undefined1 local_278 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  undefined1 local_268 [16];
  shared_ptr<HuffmanNode> local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  element_type *local_230;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228 [2];
  undefined1 local_218 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_1f8;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_1e8;
  shared_ptr<HuffmanNode> local_1b8;
  HuffmanNode local_1a8 [2];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Huffman decryption...",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  pcVar5 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
  local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar5,pcVar5 + (this->super_Cryptor).in_message_._M_string_length
            );
  std::__cxx11::string::substr((ulong)local_228,(ulong)&local_1b8);
  if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1a8) {
    operator_delete(local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_1a8[0]._0_8_ + 1);
  }
  _Var9._M_pi = local_228[0]._M_pi;
  puVar12 = (uint *)__errno_location();
  uVar4 = *puVar12;
  this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar4;
  *puVar12 = 0;
  p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            strtol(_Var9._M_pi,(char **)&local_1b8,2);
  if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)_Var9._M_pi) {
LAB_00108fbf:
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar11 = (int)p_Var13;
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)iVar11 == p_Var13) &&
       (*puVar12 != 0x22)) {
      if (*puVar12 == 0) {
        *puVar12 = uVar4;
      }
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1e8._M_impl.super__Rb_tree_header._M_header;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_238._M_pi = p_Var13;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < iVar11) {
        local_230 = (element_type *)(ulong)(uint)(iVar11 * 2);
        uVar21 = 0;
        this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278;
        do {
          pcVar5 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
          local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (HuffmanNode *)&local_248;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,pcVar5,
                     pcVar5 + (this->super_Cryptor).in_message_._M_string_length);
          std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&local_258);
          if (local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (HuffmanNode *)&local_248) {
            operator_delete(local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(ulong)((long)&(local_248._M_pi)->_vptr__Sp_counted_base + 1));
          }
          local_278 = (undefined1  [8])local_268;
          pcVar5 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)this_03,pcVar5,
                     pcVar5 + (this->super_Cryptor).in_message_._M_string_length);
          std::__cxx11::string::substr((ulong)&local_258,(ulong)this_03);
          if (local_278 != (undefined1  [8])local_268) {
            operator_delete((void *)local_278,(ulong)(local_268._0_8_ + 1));
          }
          peVar8 = local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar4 = *puVar12;
          *puVar12 = 0;
          lVar14 = strtol(&(local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->c_,(char **)this_03,2);
          peVar10 = local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (local_278 == (undefined1  [8])peVar8) {
LAB_00108fa7:
            std::__throw_invalid_argument("stoi");
LAB_00108fb3:
            std::__throw_out_of_range("stoi");
            goto LAB_00108fbf;
          }
          if ((lVar14 - 0x80000000U < 0xffffffff00000000) || (*puVar12 == 0x22)) goto LAB_00108fb3;
          if (*puVar12 == 0) {
            *puVar12 = uVar4;
          }
          uVar4 = *puVar12;
          *puVar12 = 0;
          lVar15 = strtol(&(local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->c_,(char **)this_03,2);
          if (local_278 == (undefined1  [8])peVar10) {
            std::__throw_invalid_argument("stoi");
LAB_00108f9b:
            std::__throw_out_of_range("stoi");
            goto LAB_00108fa7;
          }
          if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*puVar12 == 0x22)) goto LAB_00108f9b;
          if (*puVar12 == 0) {
            *puVar12 = uVar4;
          }
          local_288 = (undefined1 *)CONCAT71(local_288._1_7_,(char)lVar15);
          pmVar16 = std::
                    map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                    operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                *)&local_1e8,(key_type *)&local_288);
          *pmVar16 = (mapped_type)lVar14;
          if (local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (HuffmanNode *)&local_248) {
            operator_delete(local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(ulong)((long)&(local_248._M_pi)->_vptr__Sp_counted_base + 1));
          }
          if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              local_1a8) {
            operator_delete(local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,local_1a8[0]._0_8_ + 1);
          }
          uVar21 = uVar21 + 2;
        } while (uVar21 < local_230);
      }
      p_Var2 = &local_1e8._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
        p_Var18 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(0x28);
          iVar11 = *(int *)&p_Var18[1].field_0x4;
          (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->c_ =
               (char)p_Var18[1]._M_color;
          (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->n_ =
               iVar11;
          ((local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->left_).
          super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          ((local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->left_).
          super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ((local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->right_).
          super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          ((local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->right_).
          super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<HuffmanNode*>
                    (&local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          p_Var17 = std::__cxx11::
                    list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                    ::_M_create_node<std::shared_ptr<HuffmanNode>const&>
                              ((list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                                *)&this->nodes_,&local_1b8);
          std::__detail::_List_node_base::_M_hook(&p_Var17->super__List_node_base);
          psVar1 = &(this->nodes_).
                    super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
        } while ((_Rb_tree_header *)p_Var18 != p_Var2);
      }
      this_00 = &this->nodes_;
      if (1 < (this->nodes_).
              super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
              ._M_impl._M_node._M_size) {
        this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278;
        do {
          std::__cxx11::
          list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
          sort<HuffmanComparator>(this_00);
          p_Var6 = (this_00->
                   super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var6[1]._M_next;
          local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var6 + 1) + 8);
          if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          std::__cxx11::
          list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
          _M_erase(this_00,(this_00->
                           super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                           )._M_impl._M_node.super__List_node_base._M_next);
          p_Var6 = (this_00->
                   super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var6[1]._M_next;
          local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var6 + 1) + 8);
          if ((element_type *)
              local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((element_type *)
                        local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->left_).
                       super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((element_type *)
                             local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->left_).
                            super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((element_type *)
                        local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->left_).
                       super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((element_type *)
                             local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->left_).
                            super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
            }
          }
          std::__cxx11::
          list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
          _M_erase(this_00,(this_00->
                           super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                           )._M_impl._M_node.super__List_node_base._M_next);
          this_02 = (HuffmanNode *)operator_new(0x28);
          HuffmanNode::HuffmanNode(this_02,&local_1b8,&local_258);
          local_278 = (undefined1  [8])this_02;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<HuffmanNode*>
                    (&local_270,this_02);
          p_Var17 = std::__cxx11::
                    list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                    ::_M_create_node<std::shared_ptr<HuffmanNode>const&>
                              ((list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                                *)this_00,(shared_ptr<HuffmanNode> *)this_03);
          std::__detail::_List_node_base::_M_hook(&p_Var17->super__List_node_base);
          psVar1 = &(this->nodes_).
                    super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (local_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270._M_pi);
          }
          if ((element_type *)
              local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        } while (1 < (this->nodes_).
                     super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                     ._M_impl._M_node._M_size);
      }
      p_Var6 = (this_00->
               super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      local_288 = (undefined1 *)p_Var6[1]._M_next;
      local_280._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var6 + 1) + 8);
      if (local_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_280._M_pi)->_M_use_count = (local_280._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_280._M_pi)->_M_use_count = (local_280._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      local_278 = (undefined1  [8])local_268;
      pcVar5 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_278,pcVar5,
                 pcVar5 + (this->super_Cryptor).in_message_._M_string_length);
      std::__cxx11::string::substr((ulong)&local_258,(ulong)local_278);
      if (local_278 != (undefined1  [8])local_268) {
        operator_delete((void *)local_278,(ulong)(local_268._0_8_ + 1));
      }
      _Var9._M_pi = local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar8 = local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((element_type *)
          local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (element_type *)0x0) {
        lVar14 = 0;
        do {
          this_01._M_pi = local_280._M_pi;
          cVar3 = *(char *)(lVar14 + (long)&peVar8->c_);
          if (cVar3 == '1') {
            puVar20 = *(undefined1 **)(local_288 + 0x18);
            p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_288 + 0x20);
LAB_00108d62:
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
              }
            }
            bVar22 = local_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_288 = puVar20;
            local_280._M_pi = p_Var13;
            if (bVar22) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
            }
          }
          else if (cVar3 == '0') {
            puVar20 = *(undefined1 **)(local_288 + 8);
            p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_288 + 0x10);
            goto LAB_00108d62;
          }
          lVar15 = *(long *)(local_288 + 0x18);
          p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_288 + 0x20);
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            }
          }
          if (lVar15 == 0) {
            lVar7 = *(long *)(local_288 + 8);
            this_03 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_288 + 0x10);
            if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_03->_M_use_count = this_03->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_03->_M_use_count = this_03->_M_use_count + 1;
              }
            }
            bVar22 = lVar7 == 0;
          }
          else {
            bVar22 = false;
          }
          if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && lVar15 == 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
          }
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          if (bVar22) {
            local_278[0] = *local_288;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_278,1);
            std::ostream::flush();
            p_Var6 = (this_00->
                     super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next;
            local_288 = (undefined1 *)p_Var6[1]._M_next;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_280,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)(p_Var6 + 1) + 8));
          }
          lVar14 = lVar14 + 1;
        } while (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar14);
      }
      if (local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (HuffmanNode *)&local_248) {
        operator_delete(local_258.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,(ulong)((long)&(local_248._M_pi)->_vptr__Sp_counted_base + 1));
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(this->super_Cryptor).out_message_,(string *)&local_208);
      if (local_208._M_pi != &local_1f8) {
        operator_delete(local_208._M_pi,
                        (ulong)((long)(_func_int ***)local_1f8._vptr__Sp_counted_base + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"decryption done!",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      if (local_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280._M_pi);
      }
      std::
      _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
      ::~_Rb_tree(&local_1e8);
      if ((HuffmanNode *)local_228[0]._M_pi != (HuffmanNode *)local_218) {
        operator_delete(local_228[0]._M_pi,local_218._0_8_ + 1);
      }
      return;
    }
  }
  uVar19 = std::__throw_out_of_range("stoi");
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278,(ulong)(local_268._0_8_ + 1));
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280._M_pi);
  }
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&local_1e8);
  if ((HuffmanNode *)local_228[0]._M_pi != (HuffmanNode *)local_218) {
    operator_delete(local_228[0]._M_pi,local_218._0_8_ + 1);
  }
  _Unwind_Resume(uVar19);
}

Assistant:

void HuffmanDecoder::run() {
  cout << "Huffman decryption..." << endl;

  const auto s_amount = get_in_message().substr(0, 8);
  const auto amount = stoi(s_amount, nullptr, 2);
  map<char, int> symbols;
  for (auto i = 0; i < amount * 2; i += 2) {
    const auto char_index = 8 * (i + 1);
    const auto freq_index = 8 * (i + 2);
    auto s_char = get_in_message().substr(static_cast<unsigned long>(char_index), 8);
    auto s_freq = get_in_message().substr(static_cast<unsigned long>(freq_index), 8);
    symbols[stoi(s_char, nullptr, 2)] = stoi(s_freq, nullptr, 2);
  }

  for (auto& symbol : symbols) {
    shared_ptr<HuffmanNode> node(new HuffmanNode(symbol.first, symbol.second));
    nodes_.push_back(node);
  }

  //building the tree
  while (nodes_.size() > 1) {
    nodes_.sort(HuffmanComparator());

    auto left_son = nodes_.front();
    nodes_.pop_front();
    auto right_son = nodes_.front();
    nodes_.pop_front();

    shared_ptr<HuffmanNode> parent(new HuffmanNode(left_son, right_son));
    nodes_.push_back(parent);
  }

  auto root = nodes_.front();

  stringstream output;
  //saving decoded message
  for (auto& c : get_in_message().substr(static_cast<unsigned long>(amount * 16 + 8))) {
    if (c == '0') {
      root = root->get_left();
    }
    else if (c == '1') {
      root = root->get_right();
    }

    if (root->get_right() == nullptr &&
      root->get_left() == nullptr) {
      output << root->get_c() << flush;
      root = nodes_.front();
    }
  }
  set_out_message(output.str());

  cout << "decryption done!" << endl;
}